

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
anon_unknown.dwarf_a31374::EffectiveWidthVisitor::visit<slang::ast::UnaryExpression>
          (EffectiveWidthVisitor *this,UnaryExpression *expr)

{
  bool bVar1;
  UnaryExpression *in_RSI;
  Expression *in_stack_ffffffffffffffe0;
  _Optional_payload_base<unsigned_int> local_8;
  
  bVar1 = slang::ast::Expression::bad(in_stack_ffffffffffffffe0);
  if (bVar1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
  }
  else {
    local_8 = (_Optional_payload_base<unsigned_int>)
              slang::ast::UnaryExpression::getEffectiveWidthImpl(in_RSI);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> visit(const T& expr) {
        if constexpr (requires { expr.getEffectiveWidthImpl(); }) {
            if (expr.bad())
                return std::nullopt;

            return expr.getEffectiveWidthImpl();
        }
        else {
            return expr.type->getBitWidth();
        }
    }